

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O3

bool __thiscall
slang::ast::MemberAccessExpression::requireLValueImpl
          (MemberAccessExpression *this,ASTContext *context,SourceLocation location,
          bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  SymbolKind SVar1;
  ValueSymbol *symbol;
  bool bVar2;
  uint uVar3;
  Scope *scope;
  Type *pTVar4;
  Symbol *pSVar5;
  Scope *pSVar6;
  Diagnostic *pDVar7;
  NetSymbol *net;
  Type *this_00;
  undefined1 in_stack_00000008 [16];
  
  pTVar4 = (this->value_->type).ptr;
  this_00 = pTVar4->canonical;
  if (this_00 == (Type *)0x0) {
    Type::resolveCanonical(pTVar4);
    this_00 = pTVar4->canonical;
  }
  pTVar4 = this_00->canonical;
  if (pTVar4 == (Type *)0x0) {
    Type::resolveCanonical(this_00);
    pTVar4 = this_00->canonical;
  }
  symbol = (ValueSymbol *)this->member;
  uVar3 = (symbol->super_Symbol).kind - Variable;
  if ((pTVar4->super_Symbol).kind - ClassType < 3) {
    if ((uVar3 < 0x19) && ((0x1800c0fU >> (uVar3 & 0x1f) & 1) != 0)) {
      if (longestStaticPrefix == (Expression *)0x0) {
        longestStaticPrefix = &this->super_Expression;
      }
      ASTContext::addDriver(context,symbol,longestStaticPrefix,flags);
      bVar2 = ValueExpressionBase::checkVariableAssignment
                        ((ValueExpressionBase *)context,(ASTContext *)this->member,
                         (VariableSymbol *)(ulong)flags.m_bits,
                         (bitmask<slang::ast::AssignFlags>)location._0_1_,
                         (this->super_Expression).sourceRange.startLoc,
                         (SourceRange)in_stack_00000008);
      return bVar2;
    }
    if (((ulong)location & 0xfffffff) == 0) {
      location = (this->super_Expression).sourceRange.startLoc;
    }
    pDVar7 = ASTContext::addDiag(context,(DiagCode)0x560007,location);
    Diagnostic::addNote(pDVar7,(DiagCode)0x50001,this->member->location);
    Diagnostic::operator<<(pDVar7,(this->super_Expression).sourceRange);
  }
  else {
    if (((0x18 < uVar3) || ((0x1800c0fU >> (uVar3 & 0x1f) & 1) == 0)) ||
       ((symbol[1].super_Symbol.field_0x4 & 4) == 0)) {
LAB_004b6e27:
      pSVar5 = Expression::getSymbolReference(this->value_,true);
      if (((pSVar5 != (Symbol *)0x0) && (pSVar5->kind == Net)) &&
         (*(int *)(pSVar5[5].name._M_str + 0x80) == 0xe)) {
        pDVar7 = ASTContext::addDiag(context,(DiagCode)0xa80007,(this->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar7,pSVar5->name);
      }
      if (longestStaticPrefix == (Expression *)0x0) {
        longestStaticPrefix = &this->super_Expression;
      }
      bVar2 = Expression::requireLValue(this->value_,context,location,flags,longestStaticPrefix);
      return bVar2;
    }
    pSVar6 = (symbol->super_Symbol).parentScope;
    if (pSVar6 != (Scope *)0x0) {
      do {
        SVar1 = pSVar6->thisSym->kind;
        if ((SVar1 - CovergroupBody < 3) || (SVar1 == CovergroupType)) {
          if (pSVar6 == (context->scope).ptr) goto LAB_004b6e27;
          break;
        }
        pSVar6 = pSVar6->thisSym->parentScope;
      } while (pSVar6 != (Scope *)0x0);
    }
    pDVar7 = ASTContext::addDiag(context,(DiagCode)0x450007,location);
    Diagnostic::operator<<(pDVar7,this->member->name);
  }
  return false;
}

Assistant:

bool MemberAccessExpression::requireLValueImpl(const ASTContext& context, SourceLocation location,
                                               bitmask<AssignFlags> flags,
                                               const Expression* longestStaticPrefix) const {
    // If this is a selection of a class or covergroup member, assignability depends only
    // on the selected member and not on the handle itself. Otherwise, the opposite is true.
    auto& valueType = value().type->getCanonicalType();
    if (valueType.isClass() || valueType.isCovergroup() || valueType.isVoid()) {
        if (VariableSymbol::isKind(member.kind)) {
            if (!longestStaticPrefix)
                longestStaticPrefix = this;

            auto& var = member.as<VariableSymbol>();
            context.addDriver(var, *longestStaticPrefix, flags);

            return ValueExpressionBase::checkVariableAssignment(context,
                                                                member.as<VariableSymbol>(), flags,
                                                                location, sourceRange);
        }

        if (!location)
            location = sourceRange.start();

        auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
        diag.addNote(diag::NoteDeclarationHere, member.location);
        diag << sourceRange;
        return false;
    }

    if (VariableSymbol::isKind(member.kind) &&
        member.as<VariableSymbol>().flags.has(VariableFlags::ImmutableCoverageOption) &&
        !isWithinCovergroup(member, *context.scope)) {
        context.addDiag(diag::CoverOptionImmutable, location) << member.name;
        return false;
    }

    if (auto sym = value().getSymbolReference(); sym && sym->kind == SymbolKind::Net) {
        auto& net = sym->as<NetSymbol>();
        if (net.netType.netKind == NetType::UserDefined)
            context.addDiag(diag::UserDefPartialDriver, sourceRange) << net.name;
    }

    if (!longestStaticPrefix)
        longestStaticPrefix = this;

    return value().requireLValue(context, location, flags, longestStaticPrefix);
}